

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

optional<std::array<tinyusdz::value::half,_3UL>_> * __thiscall
tinyusdz::primvar::PrimVar::get_default_value<std::array<tinyusdz::value::half,3ul>>
          (optional<std::array<tinyusdz::value::half,_3UL>_> *__return_storage_ptr__,PrimVar *this)

{
  optional<std::array<tinyusdz::value::half,_3UL>_> local_20;
  PrimVar *local_18;
  PrimVar *this_local;
  
  local_18 = this;
  this_local = (PrimVar *)__return_storage_ptr__;
  get_value<std::array<tinyusdz::value::half,3ul>>(&local_20,this);
  nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::
  optional<std::array<tinyusdz::value::half,_3UL>,_0>(__return_storage_ptr__,&local_20);
  nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::~optional(&local_20);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_default_value() const {
    return get_value<T>();
  }